

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridAxis.cpp
# Opt level: O2

void __thiscall DIS::GridAxis::marshal(GridAxis *this,DataStream *dataStream)

{
  DataStream::operator<<(dataStream,this->_domainInitialXi);
  DataStream::operator<<(dataStream,this->_domainFinalXi);
  DataStream::operator<<(dataStream,this->_domainPointsXi);
  DataStream::operator<<(dataStream,this->_interleafFactor);
  DataStream::operator<<(dataStream,this->_axisType);
  DataStream::operator<<(dataStream,this->_numberOfPointsOnXiAxis);
  DataStream::operator<<(dataStream,this->_initialIndex);
  return;
}

Assistant:

void GridAxis::marshal(DataStream& dataStream) const
{
    dataStream << _domainInitialXi;
    dataStream << _domainFinalXi;
    dataStream << _domainPointsXi;
    dataStream << _interleafFactor;
    dataStream << _axisType;
    dataStream << _numberOfPointsOnXiAxis;
    dataStream << _initialIndex;
}